

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Matrix<double,_4,_4,_0,_4,_4> *
getGTTransformations<double>(Matrix<double,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  int iVar1;
  ostream *poVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Type local_228;
  Type local_1f0;
  non_const_type local_1b8;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_1b0 [32];
  double local_190;
  AngleAxis<double> local_188;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_168 [32];
  double local_148;
  AngleAxis<double> local_140;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_120 [32];
  double local_100;
  AngleAxis<double> local_f8;
  QuaternionType local_d8;
  QuaternionType local_b8;
  undefined1 local_90 [8];
  Matrix<double,_3,_1,_0,_3,_1> tranGT;
  Matrix<double,_3,_3,_0,_3,_3> rotGT;
  double angZ;
  double angY;
  double angX;
  Matrix<double,_4,_4,_0,_4,_4> *pMStack_10;
  bool verbose_local;
  Matrix<double,_4,_4,_0,_4,_4> *transOut;
  
  angX._7_1_ = verbose;
  pMStack_10 = __return_storage_ptr__;
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(__return_storage_ptr__);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)((long)&angX + 4),4,4);
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)((long)&angX + 4));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_90);
  iVar1 = rand();
  dVar4 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar5 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar6 = (double)(iVar1 % 200) / 5.0;
  if ((angX._7_1_ & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Rand() angles = (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_100 = (dVar6 * 3.141592653589793) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_f8,&local_100,local_120);
  local_148 = (dVar5 * 3.141592653589793) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_140,&local_148,local_168);
  Eigen::AngleAxis<double>::operator*(&local_d8,&local_f8,&local_140);
  local_190 = (dVar4 * 3.141592653589793) / 360.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            (&local_188,&local_190,local_1b0);
  Eigen::operator*(&local_b8,&local_d8,&local_188);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(RotationBase<Eigen::Quaternion<double,_0>,_3> *)&local_b8);
  if ((angX._7_1_ & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"GT Rotation Matrix: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      (tranGT.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array + 2));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = rand();
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_90,0);
  *pSVar3 = (double)(iVar1 % 200) / 10.0 - 10.0;
  iVar1 = rand();
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_90,1);
  *pSVar3 = (double)(iVar1 % 200) / 10.0 - 10.0;
  iVar1 = rand();
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_90,2);
  *pSVar3 = (double)(iVar1 % 200) / 10.0 - 10.0;
  if ((angX._7_1_ & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"GT Translation Vector: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1b8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_90);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_1b8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_1f0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,3,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_1f0,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (tranGT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_228,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_228,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}